

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Offset<reflection::Field> __thiscall
flatbuffers::FieldDef::Serialize
          (FieldDef *this,FlatBufferBuilder *builder,uint16_t id,Parser *parser)

{
  bool bVar1;
  uint16_t offset;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> documentation
  ;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attributes;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> type;
  bool bVar2;
  bool required;
  bool optional;
  Offset<flatbuffers::String> name;
  Offset<reflection::Field> OVar3;
  char *pcVar4;
  double local_b0;
  int64_t local_a0;
  double local_70;
  double d;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> docs__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attr__;
  Offset<reflection::Type> type__;
  Offset<flatbuffers::String> name__;
  Parser *parser_local;
  uint16_t id_local;
  FlatBufferBuilder *builder_local;
  FieldDef *this_local;
  
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,(string *)this);
  docs__.o = (offset_type)Type::Serialize(&(this->value).type,builder);
  d._4_4_ = Definition::SerializeAttributes(&this->super_Definition,builder,parser);
  if (((parser->opts).binary_schema_comments & 1U) != 0) {
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->super_Definition).doc_comment);
    if (!bVar2) {
      d._0_4_ = FlatBufferBuilderImpl<false>::
                CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                          (builder,&(this->super_Definition).doc_comment);
      goto LAB_00134475;
    }
  }
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>::Offset
            ((Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> *
             )&d,0);
LAB_00134475:
  pcVar4 = (char *)std::__cxx11::string::c_str();
  StringToNumber<double>(pcVar4,&local_70);
  type = docs__;
  offset = (this->value).offset;
  bVar2 = IsInteger((this->value).type.base_type);
  if (bVar2) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_a0 = StringToInt(pcVar4,10);
  }
  else {
    local_a0 = 0;
  }
  bVar2 = IsFloat((this->value).type.base_type);
  if (bVar2) {
    local_b0 = local_70;
  }
  else {
    local_b0 = 0.0;
  }
  bVar2 = this->deprecated;
  required = IsRequired(this);
  attributes.o = d._4_4_;
  documentation.o = d._0_4_;
  bVar1 = this->key;
  optional = IsOptional(this);
  OVar3 = reflection::CreateField
                    (builder,name,type.o,id,offset,local_a0,local_b0,(bool)(bVar2 & 1),required,
                     (bool)(bVar1 & 1),attributes,documentation,optional,(uint16_t)this->padding,
                     (bool)(this->offset64 & 1));
  return (Offset<reflection::Field>)OVar3.o;
}

Assistant:

Offset<reflection::Field> FieldDef::Serialize(FlatBufferBuilder *builder,
                                              uint16_t id,
                                              const Parser &parser) const {
  auto name__ = builder->CreateString(name);
  auto type__ = value.type.Serialize(builder);
  auto attr__ = SerializeAttributes(builder, parser);
  auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                    ? builder->CreateVectorOfStrings(doc_comment)
                    : 0;
  double d;
  StringToNumber(value.constant.c_str(), &d);
  return reflection::CreateField(
      *builder, name__, type__, id, value.offset,
      // Is uint64>max(int64) tested?
      IsInteger(value.type.base_type) ? StringToInt(value.constant.c_str()) : 0,
      // result may be platform-dependent if underlying is float (not double)
      IsFloat(value.type.base_type) ? d : 0.0, deprecated, IsRequired(), key,
      attr__, docs__, IsOptional(), static_cast<uint16_t>(padding), offset64);
  // TODO: value.constant is almost always "0", we could save quite a bit of
  // space by sharing it. Same for common values of value.type.
}